

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalPtr.hpp
# Opt level: O2

char * __thiscall BCL::GlobalPtr<char>::local(GlobalPtr<char> *this)

{
  debug_error *this_00;
  allocator<char> local_39;
  string local_38;
  
  if (this->rank == my_rank) {
    return (char *)(smem_base_ptr + this->ptr);
  }
  this_00 = (debug_error *)__cxa_allocate_exception(0x40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"calling local() on a remote GlobalPtr\n",&local_39);
  debug_error::debug_error(this_00,&local_38);
  __cxa_throw(this_00,&debug_error::typeinfo,debug_error::~debug_error);
}

Assistant:

T *local() const {
    if (rank != BCL::rank()) {
      BCL_DEBUG(throw debug_error("calling local() on a remote GlobalPtr\n"));
      return nullptr;
    } else {
      return (T *) (((char *) BCL::smem_base_ptr) + ptr);
    }
  }